

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O2

nng_err nng_http_server_get_addr(nng_http_server *srv,nng_sockaddr *addr)

{
  nng_err nVar1;
  size_t local_10;
  size_t size;
  
  local_10 = 0x88;
  if (addr == (nng_sockaddr *)0x0 || srv == (nng_http_server *)0x0) {
    nVar1 = NNG_EINVAL;
  }
  else {
    nVar1 = nni_http_server_get(srv,"local-address",addr,&local_10,NNI_TYPE_SOCKADDR);
  }
  return nVar1;
}

Assistant:

nng_err
nng_http_server_get_addr(nng_http_server *srv, nng_sockaddr *addr)
{
#ifdef NNG_SUPP_HTTP
	size_t size = sizeof(nng_sockaddr);
	if (srv == NULL || addr == NULL)
		return NNG_EINVAL;
	return (nni_http_server_get(
	    srv, NNG_OPT_LOCADDR, addr, &size, NNI_TYPE_SOCKADDR));
#else
	NNI_ARG_UNUSED(srv);
	NNI_ARG_UNUSED(addr);
	return (NNG_ENOTSUP);
#endif
}